

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O1

int adl_getNextBank(ADL_MIDIPlayer *device,ADL_Bank *bank)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  
  iVar1 = -1;
  if (device != (ADL_MIDIPlayer *)0x0) {
    if (device->adl_midiPlayer == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x161,"int adl_getNextBank(ADL_MIDIPlayer *, ADL_Bank *)");
    }
    pvVar2 = bank->pointer[2];
    pvVar3 = *bank->pointer[1];
    if (pvVar3 == (void *)0x0) {
      pvVar2 = (void *)((long)pvVar2 + 1);
      if (pvVar2 < (void *)0x100) {
        do {
          pvVar3 = *(void **)((long)bank->pointer[0] + (long)pvVar2 * 8);
          if (pvVar3 != (void *)0x0) goto LAB_00133cde;
          pvVar2 = (void *)((long)pvVar2 + 1);
        } while (pvVar2 != (void *)0x100);
        pvVar2 = (void *)0x100;
      }
      else {
        pvVar3 = (void *)0x0;
      }
    }
LAB_00133cde:
    if (pvVar2 != (void *)0x100 ||
        (bank->pointer[0] != *(void **)(*(long *)((long)device->adl_midiPlayer + 0x198) + 0xa0) ||
        pvVar3 != (void *)0x0)) {
      bank->pointer[1] = pvVar3;
      bank->pointer[2] = pvVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

ADLMIDI_EXPORT int adl_getNextBank(ADL_MIDIPlayer *device, ADL_Bank *bank)
{
    if(!device)
        return -1;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;

    Synth::BankMap::iterator it = Synth::BankMap::iterator::from_ptrs(bank->pointer);
    if(++it == map.end())
        return -1;

    it.to_ptrs(bank->pointer);
    return 0;
}